

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-to-vpack.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  undefined8 in_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  Slice SVar9;
  _Hash_node_base *p_Var10;
  ostream *poVar11;
  uint8_t *puVar12;
  undefined4 uVar13;
  int iVar14;
  char *unaff_RBX;
  uint64_t id;
  __node_base _Var15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  string_view key;
  allocator<char> local_85ca;
  allocator<char> local_85c9;
  uint local_85c8;
  uint local_85c4;
  char *local_85c0;
  undefined4 local_85b4;
  shared_ptr<arangodb::velocypack::Builder> builder;
  shared_ptr<arangodb::velocypack::Builder> builder_1;
  _Any_data local_8570;
  code *local_8560;
  code *local_8558;
  string s;
  string infile;
  Options local_8508;
  Parser parser;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  keysFound;
  ofstream ofs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8438 [4];
  uint64_t local_8418;
  ifstream ifs;
  size_type local_8238;
  int aiStack_8220 [122];
  char buffer [32768];
  
  local_85c4 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  bVar6 = false;
  bVar5 = false;
  local_85c8 = 0;
  bVar7 = true;
  pcVar16 = (char *)0x0;
  local_85c0 = (char *)0x0;
  for (lVar18 = 1; lVar18 < argc; lVar18 = lVar18 + 1) {
    unaff_RBX = argv[lVar18];
    if (bVar7) {
      bVar4 = isOption(unaff_RBX,"--help");
      if (bVar4) {
        usage(argv);
        return 0;
      }
      bVar4 = isOption(unaff_RBX,"--compact");
      if (bVar4) {
        local_85c4 = (uint)CONCAT71(extraout_var,1);
      }
      else {
        bVar4 = isOption(unaff_RBX,"--no-compact");
        if (bVar4) {
          local_85c4 = 0;
        }
        else {
          bVar4 = isOption(unaff_RBX,"--compress");
          if (bVar4) {
            local_85c8 = (uint)CONCAT71(extraout_var_00,1);
          }
          else {
            bVar4 = isOption(unaff_RBX,"--no-compress");
            if (bVar4) {
              local_85c8 = 0;
            }
            else {
              bVar4 = isOption(unaff_RBX,"--hex");
              if (bVar4) {
                bVar5 = true;
              }
              else {
                bVar4 = isOption(unaff_RBX,"--stringify");
                if (!bVar4) {
                  bVar4 = isOption(unaff_RBX,"--");
                  if (!bVar4) goto LAB_00103629;
                  bVar7 = false;
                  pcVar17 = local_85c0;
                  goto LAB_00103643;
                }
                bVar6 = true;
              }
            }
          }
        }
      }
      bVar7 = true;
      pcVar17 = local_85c0;
    }
    else {
LAB_00103629:
      pcVar17 = unaff_RBX;
      if ((local_85c0 != (char *)0x0) &&
         (bVar4 = pcVar16 != (char *)0x0, pcVar16 = unaff_RBX, pcVar17 = local_85c0, bVar4)) {
        usage(argv);
        return 1;
      }
    }
LAB_00103643:
    local_85c0 = pcVar17;
  }
  pcVar17 = "-";
  if (local_85c0 != (char *)0x0) {
    pcVar17 = local_85c0;
  }
  if ((pcVar16 == (char *)0x0) || ((*pcVar16 == '+' && (pcVar16[1] == '\0')))) {
    pcVar16 = "/proc/self/fd/1";
    uVar13 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  }
  else {
    uVar13 = 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,pcVar17,(allocator<char> *)buffer);
  bVar7 = std::operator==(&infile,"-");
  if (bVar7) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&infile,"/proc/self/fd/0");
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&ifs,(string *)&infile,_S_in);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Cannot read infile \'");
    poVar11 = std::operator<<(poVar11,(string *)&infile);
    poVar11 = std::operator<<(poVar11,"\'");
    std::endl<char,std::char_traits<char>>(poVar11);
    iVar14 = 1;
    goto LAB_00103f01;
  }
  local_85b4 = uVar13;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (&s,0x8000);
  while (*(int *)((long)aiStack_8220 + *(long *)(_ifs + -0x18)) == 0) {
    std::istream::read((char *)&ifs,(long)buffer);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&s,buffer,local_8238);
  }
  std::ifstream::close();
  local_8508.unsupportedTypeBehavior = FailOnUnsupportedType;
  local_8508.paddingBehavior = Flexible;
  local_8508.attributeTranslator = (AttributeTranslator *)0x0;
  local_8508.customTypeHandler._0_5_ = 0;
  local_8508.clearBuilderBeforeParse = true;
  local_8508.validateUtf8Strings = false;
  local_8508.checkAttributeUniqueness = false;
  local_8508.escapeForwardSlashes = false;
  local_8508.escapeControl = true;
  local_8508.escapeUnicode = false;
  local_8508.dumpAttributesInIndexOrder = true;
  local_8508.unsupportedDoublesAsString = false;
  local_8508.binaryAsHex = false;
  local_8508.datesAsIntegers = false;
  local_8508.disallowExternals = false;
  local_8508.disallowCustom = false;
  local_8508.disallowTags = false;
  local_8508.disallowBCD = false;
  local_8508.debugTags = false;
  local_8508.nestingLimit = 0xffffffff;
  local_8508._21_4_ = (local_85c4 & 1) << 0x18;
  local_8508._26_3_ = 0;
  local_8508.buildUnindexedObjects = (bool)((byte)local_85c4 & 1);
  if ((local_85c8 & 1) != 0) {
    parser._builder.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x200000002;
    keysFound._M_h._M_buckets = &keysFound._M_h._M_single_bucket;
    keysFound._M_h._M_bucket_count = 1;
    parser._builder.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    parser._builderPtr._0_5_ = 0;
    parser._builderPtr._5_3_ = 0;
    parser._start._0_5_ = 0;
    keysFound._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    keysFound._M_h._M_element_count = 0;
    keysFound._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    parser._29_4_ = 1;
    parser._size._1_2_ = 1;
    parser._size._3_1_ = 1;
    parser._36_8_ = 0;
    keysFound._M_h._M_rehash_policy._M_next_resize = 0;
    keysFound._M_h._M_single_bucket = (__node_base_ptr)0x0;
    parser._pos._4_4_ = 0xffffffff;
    arangodb::velocypack::Parser::Parser((Parser *)&ofs,(Options *)&parser);
    arangodb::velocypack::Parser::parse
              ((Parser *)&ofs,(uint8_t *)s._M_dataplus._M_p,s._M_string_length,false);
    arangodb::velocypack::Parser::steal((Parser *)&builder_1);
    SVar9 = arangodb::velocypack::Builder::slice
                      (builder_1.
                       super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    local_8570._8_8_ = 0;
    local_8570._M_unused._M_object = &keysFound;
    local_8558 = std::
                 _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/tools/json-to-vpack.cpp:85:9)>
                 ::_M_invoke;
    local_8560 = std::
                 _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/tools/json-to-vpack.cpp:85:9)>
                 ::_M_manager;
    arangodb::velocypack::Collection::visitRecursive
              (SVar9,PreOrder,
               (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
               &local_8570);
    std::_Function_base::~_Function_base((_Function_base *)&local_8570);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&builder_1.
                super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_8438);
    parser._builderPtr._0_5_ = 0;
    parser._builderPtr._5_3_ = 0;
    parser._builder.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    parser._builder.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var10 = (_Hash_node_base *)0x2;
    id = 0;
    pcVar17 = (char *)0x0;
    for (_Var15 = keysFound._M_h._M_before_begin; _Var15._M_nxt != (_Hash_node_base *)0x0;
        _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt) {
      if (((_Hash_node_base *)0x1 < _Var15._M_nxt[5]._M_nxt) && (p_Var10 <= _Var15._M_nxt[2]._M_nxt)
         ) {
        id = id + 1;
        key._M_str = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (_Var15._M_nxt + 1))->_M_dataplus)._M_p;
        key._M_len = (size_t)_Var15._M_nxt[2]._M_nxt;
        local_85c0 = pcVar17;
        arangodb::velocypack::AttributeTranslator::add
                  ((AttributeTranslator *)
                   translator._M_t.
                   super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                   .super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>.
                   _M_head_impl,key,id);
        std::
        _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::_Tuple_impl((_Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                       *)&ofs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (_Var15._M_nxt + 1),(unsigned_long *)(_Var15._M_nxt + 5));
        local_8418 = id;
        std::
        vector<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>>
        ::emplace_back<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>
                  ((vector<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>>
                    *)&parser,
                   (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                    *)&ofs);
        std::__cxx11::string::~string((string *)local_8438);
        if (*(long *)((long)translator._M_t.
                            super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                            .
                            super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>
                            ._M_head_impl + 0x78) == 0xff) {
          p_Var10 = (_Hash_node_base *)0x3;
        }
        pcVar17 = local_85c0 + (long)_Var15._M_nxt[5]._M_nxt;
      }
    }
    arangodb::velocypack::AttributeTranslator::seal
              ((AttributeTranslator *)
               translator._M_t.
               super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
               ._M_t.
               super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
               .super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>.
               _M_head_impl);
    local_8508.attributeTranslator =
         (AttributeTranslator *)
         translator._M_t.
         super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
         ._M_t.
         super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
         .super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>._M_head_impl;
    if (pcVar17 != (char *)0x0 && (char)local_85b4 == '\0') {
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar11 = std::operator<<(poVar11," occurrences of Object keys will be stored compressed:");
      std::endl<char,std::char_traits<char>>(poVar11);
      _Var3 = parser._builder.
              super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      peVar2 = parser._builder.
               super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      for (lVar18 = 0;
          p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((peVar2->_arena).buf_ + lVar18 + -0x28), p_Var1 != _Var3._M_pi;
          lVar18 = lVar18 + 0x30) {
        if (lVar18 == 0x3c0) {
          poVar11 = std::operator<<((ostream *)&std::cout," - ... ");
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          poVar11 = std::operator<<(poVar11," Object key(s) follow ...");
          std::endl<char,std::char_traits<char>>(poVar11);
          break;
        }
        poVar11 = std::operator<<((ostream *)&std::cout," - #");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        poVar11 = std::operator<<(poVar11,": ");
        poVar11 = std::operator<<(poVar11,(string *)&p_Var1->_M_use_count);
        poVar11 = std::operator<<(poVar11," (");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        poVar11 = std::operator<<(poVar11," occurrences)");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    std::
    vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~vector((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)&parser);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&keysFound._M_h);
  }
  local_8508.validateUtf8Strings = true;
  arangodb::velocypack::Parser::Parser(&parser,&local_8508);
  arangodb::velocypack::Parser::parse
            (&parser,(uint8_t *)s._M_dataplus._M_p,s._M_string_length,false);
  std::ofstream::ofstream(&ofs,pcVar16,_S_out);
  uVar13 = local_85b4;
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Cannot write outfile \'");
    poVar11 = std::operator<<(poVar11,pcVar16);
    poVar11 = std::operator<<(poVar11,"\'");
    std::endl<char,std::char_traits<char>>(poVar11);
    iVar14 = 1;
  }
  else {
    if ((char)uVar13 == '\0') {
      std::ostream::seekp(&ofs,0,0);
    }
    arangodb::velocypack::Parser::steal((Parser *)&builder);
    if (bVar5) {
      SVar9 = arangodb::velocypack::Builder::slice
                        (builder.
                         super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_8570._M_pod_data," ",&local_85c9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&builder_1,"0x",&local_85ca);
      arangodb::velocypack::HexDump::HexDump
                ((HexDump *)&keysFound,SVar9,0x10,(string *)&local_8570,(string *)&builder_1);
      poVar11 = arangodb::velocypack::operator<<((ostream *)&ofs,(HexDump *)&keysFound);
      std::endl<char,std::char_traits<char>>(poVar11);
LAB_00103d64:
      arangodb::velocypack::HexDump::~HexDump((HexDump *)&keysFound);
      std::__cxx11::string::~string((string *)&builder_1);
      std::__cxx11::string::~string((string *)local_8570._M_pod_data);
    }
    else {
      if (bVar6) {
        poVar11 = std::operator<<((ostream *)&ofs,"\"");
        SVar9 = arangodb::velocypack::Builder::slice
                          (builder.
                           super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_8570._M_pod_data,"",&local_85c9);
        std::__cxx11::string::string<std::allocator<char>>((string *)&builder_1,"\\x",&local_85ca);
        arangodb::velocypack::HexDump::HexDump
                  ((HexDump *)&keysFound,SVar9,0x800,(string *)&local_8570,(string *)&builder_1);
        poVar11 = arangodb::velocypack::operator<<(poVar11,(HexDump *)&keysFound);
        poVar11 = std::operator<<(poVar11,"\"");
        std::endl<char,std::char_traits<char>>(poVar11);
        goto LAB_00103d64;
      }
      puVar12 = arangodb::velocypack::Builder::start
                          (builder.
                           super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
      arangodb::velocypack::Builder::size
                (builder.
                 super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      std::ostream::write((char *)&ofs,(long)puVar12);
    }
    std::ofstream::close();
    if ((char)uVar13 == '\0') {
      poVar11 = std::operator<<((ostream *)&std::cout,"Successfully converted JSON infile \'");
      poVar11 = std::operator<<(poVar11,(string *)&infile);
      poVar11 = std::operator<<(poVar11,"\'");
      std::endl<char,std::char_traits<char>>(poVar11);
      poVar11 = std::operator<<((ostream *)&std::cout,"JSON Infile size:    ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
      poVar11 = std::operator<<((ostream *)&std::cout,"VPack Outfile size:  ");
      arangodb::velocypack::Builder::size
                (builder.
                 super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
      if ((local_85c8 & 1) != 0) {
        if (*(long *)((long)translator._M_t.
                            super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                            .
                            super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>
                            ._M_head_impl + 0x78) == 0) {
          poVar11 = std::operator<<((ostream *)&std::cout,
                                    "Key dictionary size: 0 (no benefit from compression)");
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        else {
          poVar11 = std::operator<<((ostream *)&std::cout,"Key dictionary size: ");
          keysFound._M_h._M_buckets =
               (__buckets_ptr)
               **(undefined8 **)
                 (*(long *)translator._M_t.
                           super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                           .
                           super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>
                           ._M_head_impl + 0x10);
          arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::byteSize((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     &keysFound);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&builder.
                super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    iVar14 = 0;
  }
  std::ofstream::~ofstream(&ofs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser._builder.
              super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_00103f01:
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&infile);
  return iVar14;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  char const* outfileName = nullptr;
  bool allowFlags = true;
  bool compact = true;
  bool compress = false;
  bool hexDump = false;
  bool stringify = false;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--compact")) {
      compact = true;
    } else if (allowFlags && isOption(p, "--no-compact")) {
      compact = false;
    } else if (allowFlags && isOption(p, "--compress")) {
      compress = true;
    } else if (allowFlags && isOption(p, "--no-compress")) {
      compress = false;
    } else if (allowFlags && isOption(p, "--hex")) {
      hexDump = true;
    } else if (allowFlags && isOption(p, "--stringify")) {
      stringify = true;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else if (outfileName == nullptr) {
      outfileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

#ifdef __linux__
  // treat missing outfile as stdout
  bool toStdOut = false;
  if (outfileName == nullptr || strcmp(outfileName, "+") == 0) {
    outfileName = "/proc/self/fd/1";
    toStdOut = true;
  }
#else
  bool const toStdOut = false;
  if (outfileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }
#endif

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  char buffer[32768];
  s.reserve(sizeof(buffer));

  while (ifs.good()) {
    ifs.read(&buffer[0], sizeof(buffer));
    s.append(buffer, checkOverflow(ifs.gcount()));
  }
  ifs.close();

  Options options;
  options.buildUnindexedArrays = compact;
  options.buildUnindexedObjects = compact;

  // compress object keys?
  if (compress) {
    size_t compressedOccurrences = 0;
    std::unordered_map<std::string, size_t> keysFound;
    buildCompressedKeys(s, keysFound);

    std::vector<std::tuple<uint64_t, std::string, size_t>> stats;
    size_t requiredLength = 2;
    uint64_t nextId = 0;
    for (auto const& it : keysFound) {
      if (it.second > 1 && it.first.size() >= requiredLength) {
        translator->add(it.first, ++nextId);
        stats.emplace_back(std::make_tuple(nextId, it.first, it.second));

        if (translator->count() == 255) {
          requiredLength = 3;
        }
        compressedOccurrences += it.second;
      }
    }
    translator->seal();

    options.attributeTranslator = translator.get();

    // print statistics
    if (!toStdOut && compressedOccurrences > 0) {
      std::cout << compressedOccurrences
                << " occurrences of Object keys will be stored compressed:"
                << std::endl;

      size_t printed = 0;
      for (auto const& it : stats) {
        if (++printed > 20) {
          std::cout << " - ... " << (stats.size() - printed + 1)
                    << " Object key(s) follow ..." << std::endl;
          break;
        }
        std::cout << " - #" << std::get<0>(it) << ": " << std::get<1>(it)
                  << " (" << std::get<2>(it) << " occurrences)" << std::endl;
      }
    }
  }

  options.validateUtf8Strings = true;
  Parser parser(&options);
  try {
    parser.parse(s);
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while parsing infile '" << infile
              << "': " << ex.what() << std::endl;
    std::cerr << "Error position: " << parser.errorPos() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while parsing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  std::ofstream ofs(outfileName, std::ofstream::out);

  if (!ofs.is_open()) {
    std::cerr << "Cannot write outfile '" << outfileName << "'" << std::endl;
    return EXIT_FAILURE;
  }

  // reset stream
  if (!toStdOut) {
    ofs.seekp(0);
  }

  // write into stream
  std::shared_ptr<Builder> builder = parser.steal();
  if (hexDump) {
    ofs << HexDump(builder->slice()) << std::endl;
  } else if (stringify) {
    ofs << "\"" << HexDump(builder->slice(), 2048, "", "\\x") << "\""
        << std::endl;
  } else {
    uint8_t const* start = builder->start();
    ofs.write(reinterpret_cast<char const*>(start), builder->size());
  }

  ofs.close();

  if (!toStdOut) {
    std::cout << "Successfully converted JSON infile '" << infile << "'"
              << std::endl;
    std::cout << "JSON Infile size:    " << s.size() << std::endl;
    std::cout << "VPack Outfile size:  " << builder->size() << std::endl;

    if (compress) {
      if (translator.get()->count() > 0) {
        std::cout << "Key dictionary size: "
                  << Slice(translator.get()->builder()->data()).byteSize()
                  << std::endl;
      } else {
        std::cout << "Key dictionary size: 0 (no benefit from compression)"
                  << std::endl;
      }
    }
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}